

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

void __thiscall BuildStatus::BuildStatus(BuildStatus *this,BuildConfig *config)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  
  this->config_ = config;
  iVar3 = GetTimeMillis();
  this->start_time_millis_ = iVar3;
  this->started_edges_ = 0;
  this->finished_edges_ = 0;
  this->total_edges_ = 0;
  p_Var1 = &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  LinePrinter::LinePrinter(&this->printer_);
  this->progress_status_format_ = (char *)0x0;
  (this->overall_rate_).rate_ = -1.0;
  (this->overall_rate_).stopwatch_.started_ = 0;
  iVar2 = *(int *)(config + 8);
  (this->current_rate_).rate_ = -1.0;
  (this->current_rate_).stopwatch_.started_ = 0;
  (this->current_rate_).N = (long)iVar2;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map
            ((_Deque_base<double,_std::allocator<double>_> *)&(this->current_rate_).times_,0);
  (this->current_rate_).last_update_ = -1;
  if (*(int *)this->config_ != 0) {
    (this->printer_).smart_terminal_ = false;
  }
  pcVar4 = getenv("NINJA_STATUS");
  pcVar5 = "[%f/%t] ";
  if (pcVar4 != (char *)0x0) {
    pcVar5 = pcVar4;
  }
  this->progress_status_format_ = pcVar5;
  return;
}

Assistant:

BuildStatus::BuildStatus(const BuildConfig& config)
    : config_(config), start_time_millis_(GetTimeMillis()), started_edges_(0),
      finished_edges_(0), total_edges_(0), progress_status_format_(NULL),
      current_rate_(config.parallelism) {
  // Don't do anything fancy in verbose mode.
  if (config_.verbosity != BuildConfig::NORMAL)
    printer_.set_smart_terminal(false);

  progress_status_format_ = getenv("NINJA_STATUS");
  if (!progress_status_format_)
    progress_status_format_ = "[%f/%t] ";
}